

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.h
# Opt level: O2

void __thiscall
dg::vr::ValueRelations::set<llvm::BinaryOperator_const*,llvm::Value*>
          (ValueRelations *this,BinaryOperator **lt,Type rel,Value **rt)

{
  bool bVar1;
  reference_wrapper<const_dg::vr::Bucket> lt_00;
  pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool> pVar2;
  pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool> pVar3;
  
  pVar2 = get(this,(V)*lt);
  lt_00 = pVar2.first._M_data;
  pVar2 = get(this,*rt);
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pVar3 = get(this,(V)*lt);
    lt_00 = pVar3.first._M_data;
  }
  bVar1 = RelationsGraph<dg::vr::ValueRelations>::addRelation
                    (&this->graph,lt_00._M_data,rel,pVar2.first._M_data._M_data,(Relations *)0x0);
  this->changed = (bool)(this->changed | bVar1);
  return;
}

Assistant:

void set(const X &lt, Relations::Type rel, const Y &rt) {
        auto ltHPair = get(lt);
        auto rtHPair = get(rt);
        if (rtHPair.second) {
            ltHPair = get(lt);
            assert(!ltHPair.second);
        }
        bool ch = graph.addRelation(ltHPair.first, rel, rtHPair.first);
        updateChanged(ch);
    }